

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O2

DdNode * cuddBddPermuteRecur(DdManager *manager,DdHashTable *table,DdNode *node,int *permut)

{
  int *piVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *h;
  DdNode *value;
  DdNode *f;
  
  f = (DdNode *)((ulong)node & 0xfffffffffffffffe);
  if (f->index != 0x7fffffff) {
    if ((f->ref == 1) || (pDVar3 = cuddHashTableLookup1(table,f), pDVar3 == (DdNode *)0x0)) {
      pDVar3 = cuddBddPermuteRecur(manager,table,(f->type).kids.T,permut);
      if (pDVar3 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        h = cuddBddPermuteRecur(manager,table,(f->type).kids.E,permut);
        value = pDVar3;
        if (h != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)h & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          value = cuddBddIteRecur(manager,manager->vars[permut[f->index]],pDVar3,h);
          if (value == (DdNode *)0x0) {
            Cudd_IterDerefBdd(manager,pDVar3);
            value = h;
          }
          else {
            piVar1 = (int *)(((ulong)value & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_IterDerefBdd(manager,pDVar3);
            Cudd_IterDerefBdd(manager,h);
            if (((ulong)f->ref == 1) ||
               (iVar2 = cuddHashTableInsert1(table,f,value,(ulong)f->ref - 1), iVar2 != 0)) {
              piVar1 = (int *)(((ulong)value & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + -1;
              return (DdNode *)((ulong)value ^ (ulong)(f != node));
            }
          }
        }
        Cudd_IterDerefBdd(manager,value);
      }
      node = (DdNode *)0x0;
    }
    else {
      node = (DdNode *)((ulong)pDVar3 ^ (ulong)(f != node));
    }
  }
  return node;
}

Assistant:

static DdNode *
cuddBddPermuteRecur( DdManager * manager /* DD manager */ ,
                     DdHashTable * table /* computed table */ ,
                     DdNode * node /* BDD to be reordered */ ,
                     int *permut /* permutation array */  )
{
    DdNode *N, *T, *E;
    DdNode *res;
    int index;

    statLine( manager );
    N = Cudd_Regular( node );

    /* Check for terminal case of constant node. */
    if ( cuddIsConstant( N ) )
    {
        return ( node );
    }

    /* If problem already solved, look up answer and return. */
    if ( N->ref != 1 && ( res = cuddHashTableLookup1( table, N ) ) != NULL )
    {
        return ( Cudd_NotCond( res, N != node ) );
    }

    /* Split and recur on children of this node. */
    T = cuddBddPermuteRecur( manager, table, cuddT( N ), permut );
    if ( T == NULL )
        return ( NULL );
    cuddRef( T );
    E = cuddBddPermuteRecur( manager, table, cuddE( N ), permut );
    if ( E == NULL )
    {
        Cudd_IterDerefBdd( manager, T );
        return ( NULL );
    }
    cuddRef( E );

    /* Move variable that should be in this position to this position
       ** by retrieving the single var BDD for that variable, and calling
       ** cuddBddIteRecur with the T and E we just created.
     */
    index = permut[N->index];
    res = cuddBddIteRecur( manager, manager->vars[index], T, E );
    if ( res == NULL )
    {
        Cudd_IterDerefBdd( manager, T );
        Cudd_IterDerefBdd( manager, E );
        return ( NULL );
    }
    cuddRef( res );
    Cudd_IterDerefBdd( manager, T );
    Cudd_IterDerefBdd( manager, E );

    /* Do not keep the result if the reference count is only 1, since
       ** it will not be visited again.
     */
    if ( N->ref != 1 )
    {
        ptrint fanout = ( ptrint ) N->ref;
        cuddSatDec( fanout );
        if ( !cuddHashTableInsert1( table, N, res, fanout ) )
        {
            Cudd_IterDerefBdd( manager, res );
            return ( NULL );
        }
    }
    cuddDeref( res );
    return ( Cudd_NotCond( res, N != node ) );

}